

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O2

bool Imath_3_2::anon_unknown_20::twoSidedJacobiRotation<double>
               (Matrix44<double> *A,int j,int k,Matrix44<double> *U,Matrix44<double> *V,double tol)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  int l;
  ulong uVar10;
  double dVar11;
  double p;
  double r;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  uVar7 = (ulong)(uint)j;
  dVar1 = A->x[j][uVar7];
  uVar8 = (ulong)(uint)k;
  dVar2 = A->x[j][uVar8];
  dVar3 = A->x[k][uVar7];
  dVar4 = A->x[k][uVar8];
  bVar5 = ABS(dVar1 + dVar4) * tol < ABS(dVar2 - dVar3);
  if (bVar5) {
    dVar11 = (dVar1 + dVar4) / (dVar2 - dVar3);
    dVar13 = 1.0 / SQRT(dVar11 * dVar11 + 1.0);
    dVar13 = (double)(-(ulong)(dVar11 < 0.0) & (ulong)-dVar13 |
                     ~-(ulong)(dVar11 < 0.0) & (ulong)dVar13);
    dVar11 = dVar11 * dVar13;
    dVar16 = (dVar2 + dVar3) * dVar13 + (dVar4 - dVar1) * dVar11;
    dVar14 = dVar11 * dVar2 - dVar13 * dVar4;
    dVar14 = dVar14 + dVar14;
  }
  else {
    dVar16 = dVar4 - dVar1;
    dVar14 = dVar2 + dVar3;
    dVar11 = 1.0;
    dVar13 = 0.0;
  }
  dVar15 = ABS(dVar14);
  dVar12 = ABS(dVar16) * tol;
  if (dVar15 <= dVar12) {
    dVar16 = 1.0;
    dVar14 = 0.0;
  }
  else {
    dVar16 = dVar16 / dVar14;
    dVar14 = 1.0 / (SQRT(dVar16 * dVar16 + 1.0) + ABS(dVar16));
    dVar14 = (double)(-(ulong)(dVar16 < 0.0) & (ulong)-dVar14 |
                     ~-(ulong)(dVar16 < 0.0) & (ulong)dVar14);
    dVar16 = 1.0 / SQRT(dVar14 * dVar14 + 1.0);
    dVar14 = dVar14 * dVar16;
  }
  bVar6 = dVar15 > dVar12;
  if (((NAN(dVar12) || NAN(dVar15)) || bVar6) || bVar5) {
    dVar12 = dVar16 * dVar11 - dVar13 * dVar14;
    dVar13 = dVar11 * dVar14 + dVar13 * dVar16;
    A->x[j][uVar7] =
         (dVar1 * dVar16 - dVar14 * dVar2) * dVar12 - (dVar3 * dVar16 - dVar14 * dVar4) * dVar13;
    A->x[k][uVar8] =
         (dVar1 * dVar14 + dVar2 * dVar16) * dVar13 + (dVar3 * dVar14 + dVar4 * dVar16) * dVar12;
    A->x[k][uVar7] = 0.0;
    A->x[j][uVar8] = 0.0;
    for (uVar10 = 0; uVar10 != 4; uVar10 = uVar10 + 1) {
      if (uVar8 != uVar10 && uVar7 != uVar10) {
        dVar1 = A->x[j][uVar10];
        dVar2 = A->x[k][uVar10];
        A->x[j][uVar10] = dVar12 * dVar1 + dVar2 * -dVar13;
        A->x[k][uVar10] = dVar1 * dVar13 + dVar2 * dVar12;
      }
    }
    for (lVar9 = 0; lVar9 != 0x80; lVar9 = lVar9 + 0x20) {
      if (uVar8 << 5 != lVar9 && uVar7 << 5 != lVar9) {
        dVar1 = *(double *)((long)A->x[0] + lVar9 + uVar7 * 8);
        dVar2 = *(double *)((long)A->x[0] + lVar9 + uVar8 * 8);
        *(double *)((long)A->x[0] + lVar9 + uVar7 * 8) = dVar16 * dVar1 + dVar2 * -dVar14;
        *(double *)((long)A->x[0] + lVar9 + uVar8 * 8) = dVar1 * dVar14 + dVar2 * dVar16;
      }
    }
    jacobiRotateRight<double>(U,j,k,dVar12,dVar13);
    jacobiRotateRight<double>(V,j,k,dVar16,dVar14);
  }
  else {
    A->x[k][uVar7] = 0.0;
    A->x[j][uVar8] = 0.0;
  }
  return bVar6 || bVar5;
}

Assistant:

bool
twoSidedJacobiRotation (
    IMATH_INTERNAL_NAMESPACE::Matrix44<T>& A,
    int                                    j,
    int                                    k,
    IMATH_INTERNAL_NAMESPACE::Matrix44<T>& U,
    IMATH_INTERNAL_NAMESPACE::Matrix44<T>& V,
    const T                                tol)
{
    // Load everything into local variables to make things easier on the
    // optimizer:
    const T w = A[j][j];
    const T x = A[j][k];
    const T y = A[k][j];
    const T z = A[k][k];

    // We will keep track of whether we're actually performing any rotations,
    // since if the matrix is already diagonal we'll end up with the identity
    // as our Jacobi rotation and we can short-circuit.
    bool changed = false;

    // The first step is to symmetrize the 2x2 matrix,
    //   [ c  s ]^T [ w x ] = [ p q ]
    //   [ -s c ]   [ y z ]   [ q r ]
    T mu_1 = w + z;
    T mu_2 = x - y;

    T c, s;
    if (std::abs (mu_2) <=
        tol * std::abs (mu_1)) // Already symmetric (to tolerance)
    {                          // Note that the <= is important here
        c = T (1);             // because we want to bypass the computation
        s = T (0);             // of rho if mu_1 = mu_2 = 0.

        const T p = w;
        const T r = z;
        mu_1      = r - p;
        mu_2      = x + y;
    }
    else
    {
        // TODO is there a native inverse square root function?
        const T rho = mu_1 / mu_2;

        s = T (1) / std::sqrt (T (1) + rho * rho);
        if (rho < 0) s = -s;
        c = s * rho;

        mu_1 = s * (x + y) + c * (z - w); // = r - p
        mu_2 = T (2) * (c * x - s * z);   // = 2*q

        changed = true;
    }

    // The second stage diagonalizes,
    //   [ c2   s2 ]^T [ p q ] [ c2  s2 ]  = [ d1   0 ]
    //   [ -s2  c2 ]   [ q r ] [ -s2 c2 ]    [  0  d2 ]
    T c_2, s_2;
    if (std::abs (mu_2) <= tol * std::abs (mu_1))
    {
        c_2 = T (1);
        s_2 = T (0);
    }
    else
    {
        const T rho_2 = mu_1 / mu_2;
        T t_2 = T (1) / (std::abs (rho_2) + std::sqrt (1 + rho_2 * rho_2));
        if (rho_2 < 0) t_2 = -t_2;
        c_2 = T (1) / std::sqrt (T (1) + t_2 * t_2);
        s_2 = c_2 * t_2;

        changed = true;
    }

    const T c_1 = c_2 * c - s_2 * s;
    const T s_1 = s_2 * c + c_2 * s;

    if (!changed)
    {
        // We've decided that the off-diagonal entries are already small
        // enough, so we'll set them to zero.  This actually appears to result
        // in smaller errors than leaving them be, possibly because it prevents
        // us from trying to do extra rotations later that we don't need.
        A[k][j] = 0;
        A[j][k] = 0;
        return false;
    }

    const T d_1 = c_1 * (w * c_2 - x * s_2) - s_1 * (y * c_2 - z * s_2);
    const T d_2 = s_1 * (w * s_2 + x * c_2) + c_1 * (y * s_2 + z * c_2);

    // For the entries we just zeroed out, we'll just set them to 0, since
    // they should be 0 up to machine precision.
    A[j][j] = d_1;
    A[k][k] = d_2;
    A[k][j] = 0;
    A[j][k] = 0;

    // Rotate the entries that _weren't_ involved in the 2x2 SVD:
    for (int l = 0; l < 4; ++l)
    {
        if (l == j || l == k) continue;

        // Rotate on the left by
        //    [ 1               ]
        //    [   .             ]
        //    [     c2   s2     ]  j
        //    [        1        ]
        //    [    -s2   c2     ]  k
        //    [             .   ]
        //    [               1 ]
        //          j    k
        //
        // This has the effect of adding the (weighted) ith and jth _rows_ to
        // each other.
        const T tau1 = A[j][l];
        const T tau2 = A[k][l];
        A[j][l]      = c_1 * tau1 - s_1 * tau2;
        A[k][l]      = s_1 * tau1 + c_1 * tau2;
    }

    for (int l = 0; l < 4; ++l)
    {
        // We set the A[j/k][j/k] entries already
        if (l == j || l == k) continue;

        // Rotate on the right by
        //    [ 1               ]
        //    [   .             ]
        //    [     c2   s2     ]  j
        //    [        1        ]
        //    [    -s2   c2     ]  k
        //    [             .   ]
        //    [               1 ]
        //          j    k
        //
        // This has the effect of adding the (weighted) ith and jth _columns_ to
        // each other.
        const T tau1 = A[l][j];
        const T tau2 = A[l][k];
        A[l][j]      = c_2 * tau1 - s_2 * tau2;
        A[l][k]      = s_2 * tau1 + c_2 * tau2;
    }

    // Now apply the rotations to U and V:
    // Remember that we have
    //    R1^T * A * R2 = D
    // This is in the 2x2 case, but after doing a bunch of these
    // we will get something like this for the 3x3 case:
    //   ... R1b^T * R1a^T * A * R2a * R2b * ... = D
    //   -----------------       ---------------
    //        = U^T                    = V
    // So,
    //   U = R1a * R1b * ...
    //   V = R2a * R2b * ...
    jacobiRotateRight (U, j, k, c_1, s_1);
    jacobiRotateRight (V, j, k, c_2, s_2);

    return true;
}